

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void inlet_pointer(_inlet *x,t_gpointer *gp)

{
  t_symbol *ptVar1;
  t_atom a;
  t_atom local_10;
  
  ptVar1 = x->i_symfrom;
  if (ptVar1 == &s_pointer) {
    pd_vmess(x->i_dest,(x->i_un).iu_symto,"p",gp);
    return;
  }
  if (ptVar1 != (t_symbol *)0x0) {
    if (ptVar1 != &s_list) {
      pd_error(x->i_owner,"inlet: expected \'%s\' but got \'%s\'",ptVar1->s_name,s_pointer.s_name);
      return;
    }
    local_10.a_type = A_POINTER;
    local_10.a_w.w_gpointer = gp;
    inlet_list(x,&s_pointer,1,&local_10);
    return;
  }
  pd_pointer(x->i_dest,gp);
  return;
}

Assistant:

static void inlet_pointer(t_inlet *x, t_gpointer *gp)
{
    if (x->i_symfrom == &s_pointer)
        pd_vmess(x->i_dest, x->i_symto, "p", gp);
    else if (!x->i_symfrom) pd_pointer(x->i_dest, gp);
    else if (x->i_symfrom == &s_list)
    {
        t_atom a;
        SETPOINTER(&a, gp);
        inlet_list(x, &s_pointer, 1, &a);
    }
    else inlet_wrong(x, &s_pointer);
}